

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SliceStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicestatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  SliceStaticLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_slicestatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_slicestatic(this);
    this_00 = (SliceStaticLayerParams *)operator_new(0xa0);
    SliceStaticLayerParams::SliceStaticLayerParams(this_00);
    (this->layer_).slicestatic_ = this_00;
  }
  return (SliceStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceStaticLayerParams* NeuralNetworkLayer::mutable_slicestatic() {
  if (!has_slicestatic()) {
    clear_layer();
    set_has_slicestatic();
    layer_.slicestatic_ = new ::CoreML::Specification::SliceStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceStatic)
  return layer_.slicestatic_;
}